

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mi.h
# Opt level: O2

MI<8UL,_GF2::MOGrevlex<8UL>_> * __thiscall
GF2::MI<8UL,_GF2::MOGrevlex<8UL>_>::SelfReduce(MI<8UL,_GF2::MOGrevlex<8UL>_> *this)

{
  _List_node_base *p_Var1;
  bool bVar2;
  bool bVar3;
  iterator pos;
  bool bVar4;
  _Self __tmp;
  bool bVar5;
  
  pos._M_node = (_List_node_base *)this;
  bVar5 = false;
  do {
    while( true ) {
      bVar4 = bVar5;
      bVar5 = pos._M_node ==
              (this->
              super_list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
              ).
              super__List_base<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
              ._M_impl._M_node.super__List_node_base._M_next;
      bVar2 = !bVar5;
      if (bVar5) break;
      pos._M_node = (pos._M_node)->_M_prev;
      bVar3 = Reduce(this,pos);
      bVar5 = bVar4;
      if (bVar3) {
        Env::Trace("SelfReduce: %zu polys (%zu mons)",
                   (this->
                   super_list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                   ).
                   super__List_base<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                   ._M_impl._M_node._M_size,pos._M_node[2]._M_next);
        if (pos._M_node[2]._M_next == (_List_node_base *)0x0) {
          pos = std::__cxx11::
                list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                ::erase(&this->
                         super_list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                        ,pos._M_node);
          bVar5 = bVar2;
        }
        else {
          p_Var1 = (pos._M_node)->_M_next;
          Move(this,pos);
          pos._M_node = p_Var1;
          bVar5 = bVar2;
        }
      }
    }
    pos._M_node = (_List_node_base *)this;
    bVar5 = bVar2;
  } while (bVar4);
  return this;
}

Assistant:

MI& SelfReduce()
	{	
		// важно, чтобы система была нормализована
		assert(IsNormalized());
		// цикл замены на нормальные формы
		bool changed;
		do
		{
			changed = false;
			// двигаемся от старших многочленов к младшим
			for (iterator pos = end(); pos != begin();)
				// есть изменения?
				if (Reduce(--pos))
				{
					changed = true;
					Env::Trace("SelfReduce: %zu polys (%zu mons)", 
						Size(), pos->Size());
					// нулевая форма? исключаем
					if (*pos == 0)
						pos = RemoveAt(pos);
					// ненулевая? перемещаем
					else
						Move(pos++);
				}
		}
		while (changed);
		return *this;
	}